

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::InodeFileConfig::Serialize(InodeFileConfig *this,Message *msg)

{
  bool bVar1;
  reference str;
  reference this_00;
  Message *msg_00;
  void *data;
  size_t size;
  InodeFileConfig_MountPointMappingEntry *it_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry,_std::allocator<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Message *msg_local;
  InodeFileConfig *this_local;
  
  bVar1 = std::bitset<7UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,1,this->scan_interval_ms_);
  }
  bVar1 = std::bitset<7UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,2,this->scan_delay_ms_);
  }
  bVar1 = std::bitset<7UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,3,this->scan_batch_size_);
  }
  bVar1 = std::bitset<7UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,4,(uint)(this->do_not_scan_ & 1));
  }
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->scan_mount_points_);
  it = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->scan_mount_points_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&it), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2);
    protozero::Message::AppendString(msg,5,str);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry,_std::allocator<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry>_>
             ::begin(&this->mount_point_mapping_);
  it_1 = (InodeFileConfig_MountPointMappingEntry *)
         std::
         vector<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry,_std::allocator<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry>_>
         ::end(&this->mount_point_mapping_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry_*,_std::vector<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry,_std::allocator<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry>_>_>
                             *)&it_1), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry_*,_std::vector<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry,_std::allocator<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry>_>_>
              ::operator*(&__end2_1);
    msg_00 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,6);
    InodeFileConfig_MountPointMappingEntry::Serialize(this_00,msg_00);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry_*,_std::vector<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry,_std::allocator<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry>_>_>
    ::operator++(&__end2_1);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void InodeFileConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: scan_interval_ms
  if (_has_field_[1]) {
    msg->AppendVarInt(1, scan_interval_ms_);
  }

  // Field 2: scan_delay_ms
  if (_has_field_[2]) {
    msg->AppendVarInt(2, scan_delay_ms_);
  }

  // Field 3: scan_batch_size
  if (_has_field_[3]) {
    msg->AppendVarInt(3, scan_batch_size_);
  }

  // Field 4: do_not_scan
  if (_has_field_[4]) {
    msg->AppendTinyVarInt(4, do_not_scan_);
  }

  // Field 5: scan_mount_points
  for (auto& it : scan_mount_points_) {
    msg->AppendString(5, it);
  }

  // Field 6: mount_point_mapping
  for (auto& it : mount_point_mapping_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(6));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}